

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

bool __thiscall AllDiffDomain<0>::propagate(AllDiffDomain<0> *this)

{
  IntView<0> *pIVar1;
  Node *pNVar2;
  IntVar *pIVar3;
  Node *pNVar4;
  vec<TrailElem> *this_00;
  bool bVar5;
  uint uVar6;
  Node *pNVar7;
  ulong uVar8;
  Node *pNVar9;
  bool *pbVar10;
  long lVar11;
  int *piVar12;
  Tchar *pTVar13;
  int *pt;
  int *pt_1;
  Tint *pTVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar69;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar70;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar71;
  int iVar84;
  int iVar85;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar86;
  undefined1 in_XMM13 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  TrailElem local_58;
  uint local_48;
  int local_44;
  vec<TrailElem> *local_40;
  AllDiffDomain<0> *local_38;
  
  piVar12 = &this->queue;
  local_40 = &engine.trail;
  auVar96 = _DAT_001d7970;
  local_38 = this;
  do {
    this->queue_tail = piVar12;
    if (0 < this->sz) {
      pNVar7 = this->var_nodes;
      pNVar9 = (Node *)this->queue_tail;
      lVar11 = 0;
      do {
        if ((pNVar7->match).v < 0) {
          pNVar9->next = (int)lVar11;
          this->queue_tail = &pNVar7->next;
          pNVar9 = pNVar7;
        }
        lVar11 = lVar11 + 1;
        pNVar7 = pNVar7 + 1;
      } while (lVar11 < this->sz);
    }
    *this->queue_tail = -1;
    iVar84 = this->range;
    if (0 < (long)iVar84) {
      pNVar7 = this->val_nodes;
      lVar11 = (long)iVar84 + -1;
      auVar17._8_4_ = (int)lVar11;
      auVar17._0_8_ = lVar11;
      auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
      lVar11 = 0;
      auVar46 = _DAT_001d7960;
      auVar55 = _DAT_001db190;
      auVar59 = _DAT_001db690;
      auVar77 = _DAT_001db680;
      auVar23 = _DAT_001db670;
      auVar25 = _DAT_001db660;
      auVar27 = _DAT_001db650;
      auVar29 = _DAT_001db640;
      do {
        auVar31 = auVar17 ^ auVar96;
        auVar35 = auVar46 ^ auVar96;
        iVar69 = auVar31._0_4_;
        iVar71 = -(uint)(iVar69 < auVar35._0_4_);
        iVar70 = auVar31._4_4_;
        auVar36._4_4_ = -(uint)(iVar70 < auVar35._4_4_);
        iVar34 = auVar31._8_4_;
        iVar85 = -(uint)(iVar34 < auVar35._8_4_);
        iVar86 = auVar31._12_4_;
        auVar36._12_4_ = -(uint)(iVar86 < auVar35._12_4_);
        auVar48._4_4_ = iVar71;
        auVar48._0_4_ = iVar71;
        auVar48._8_4_ = iVar85;
        auVar48._12_4_ = iVar85;
        auVar87 = pshuflw(in_XMM13,auVar48,0xe8);
        auVar31._4_4_ = -(uint)(auVar35._4_4_ == iVar70);
        auVar31._12_4_ = -(uint)(auVar35._12_4_ == iVar86);
        auVar31._0_4_ = auVar31._4_4_;
        auVar31._8_4_ = auVar31._12_4_;
        auVar92 = pshuflw(in_XMM14,auVar31,0xe8);
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar35 = pshuflw(auVar87,auVar36,0xe8);
        auVar93._8_4_ = 0xffffffff;
        auVar93._0_8_ = 0xffffffffffffffff;
        auVar93._12_4_ = 0xffffffff;
        auVar35 = (auVar35 | auVar92 & auVar87) ^ auVar93;
        auVar35 = packssdw(auVar35,auVar35);
        if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (&pNVar7->mark)[lVar11] = false;
        }
        auVar36 = auVar31 & auVar48 | auVar36;
        auVar31 = packssdw(auVar36,auVar36);
        auVar31 = packssdw(auVar31 ^ auVar93,auVar31 ^ auVar93);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._0_4_ >> 8 & 1) != 0) {
          (&pNVar7[1].mark)[lVar11] = false;
        }
        auVar31 = auVar55 ^ auVar96;
        iVar71 = -(uint)(iVar69 < auVar31._0_4_);
        auVar92._4_4_ = -(uint)(iVar70 < auVar31._4_4_);
        iVar85 = -(uint)(iVar34 < auVar31._8_4_);
        auVar92._12_4_ = -(uint)(iVar86 < auVar31._12_4_);
        auVar35._4_4_ = iVar71;
        auVar35._0_4_ = iVar71;
        auVar35._8_4_ = iVar85;
        auVar35._12_4_ = iVar85;
        auVar87._4_4_ = -(uint)(auVar31._4_4_ == iVar70);
        auVar87._12_4_ = -(uint)(auVar31._12_4_ == iVar86);
        auVar87._0_4_ = auVar87._4_4_;
        auVar87._8_4_ = auVar87._12_4_;
        auVar92._0_4_ = auVar92._4_4_;
        auVar92._8_4_ = auVar92._12_4_;
        auVar31 = auVar87 & auVar35 | auVar92;
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packssdw(auVar31 ^ auVar93,auVar31 ^ auVar93);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
          (&pNVar7[2].mark)[lVar11] = false;
        }
        auVar35 = pshufhw(auVar35,auVar35,0x84);
        auVar48 = pshufhw(auVar87,auVar87,0x84);
        auVar36 = pshufhw(auVar35,auVar92,0x84);
        auVar35 = (auVar36 | auVar48 & auVar35) ^ auVar93;
        auVar35 = packssdw(auVar35,auVar35);
        auVar35 = packsswb(auVar35,auVar35);
        if ((auVar35._0_4_ >> 0x18 & 1) != 0) {
          (&pNVar7[3].mark)[lVar11] = false;
        }
        auVar35 = auVar59 ^ auVar96;
        iVar71 = -(uint)(iVar69 < auVar35._0_4_);
        auVar38._4_4_ = -(uint)(iVar70 < auVar35._4_4_);
        iVar85 = -(uint)(iVar34 < auVar35._8_4_);
        auVar38._12_4_ = -(uint)(iVar86 < auVar35._12_4_);
        auVar49._4_4_ = iVar71;
        auVar49._0_4_ = iVar71;
        auVar49._8_4_ = iVar85;
        auVar49._12_4_ = iVar85;
        auVar31 = pshuflw(auVar31,auVar49,0xe8);
        auVar37._4_4_ = -(uint)(auVar35._4_4_ == iVar70);
        auVar37._12_4_ = -(uint)(auVar35._12_4_ == iVar86);
        auVar37._0_4_ = auVar37._4_4_;
        auVar37._8_4_ = auVar37._12_4_;
        auVar36 = pshuflw(auVar93,auVar37,0xe8);
        auVar38._0_4_ = auVar38._4_4_;
        auVar38._8_4_ = auVar38._12_4_;
        auVar35 = pshuflw(auVar31,auVar38,0xe8);
        auVar94._8_4_ = 0xffffffff;
        auVar94._0_8_ = 0xffffffffffffffff;
        auVar94._12_4_ = 0xffffffff;
        auVar31 = (auVar35 | auVar36 & auVar31) ^ auVar94;
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (&pNVar7[4].mark)[lVar11] = false;
        }
        auVar38 = auVar37 & auVar49 | auVar38;
        auVar31 = packssdw(auVar38,auVar38);
        auVar31 = packssdw(auVar31 ^ auVar94,auVar31 ^ auVar94);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._4_2_ >> 8 & 1) != 0) {
          (&pNVar7[5].mark)[lVar11] = false;
        }
        auVar31 = auVar77 ^ auVar96;
        iVar71 = -(uint)(iVar69 < auVar31._0_4_);
        auVar72._4_4_ = -(uint)(iVar70 < auVar31._4_4_);
        iVar85 = -(uint)(iVar34 < auVar31._8_4_);
        auVar72._12_4_ = -(uint)(iVar86 < auVar31._12_4_);
        auVar39._4_4_ = iVar71;
        auVar39._0_4_ = iVar71;
        auVar39._8_4_ = iVar85;
        auVar39._12_4_ = iVar85;
        auVar50._4_4_ = -(uint)(auVar31._4_4_ == iVar70);
        auVar50._12_4_ = -(uint)(auVar31._12_4_ == iVar86);
        auVar50._0_4_ = auVar50._4_4_;
        auVar50._8_4_ = auVar50._12_4_;
        auVar72._0_4_ = auVar72._4_4_;
        auVar72._8_4_ = auVar72._12_4_;
        auVar31 = auVar50 & auVar39 | auVar72;
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packssdw(auVar31 ^ auVar94,auVar31 ^ auVar94);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (&pNVar7[6].mark)[lVar11] = false;
        }
        auVar35 = pshufhw(auVar39,auVar39,0x84);
        auVar48 = pshufhw(auVar50,auVar50,0x84);
        auVar36 = pshufhw(auVar35,auVar72,0x84);
        auVar35 = (auVar36 | auVar48 & auVar35) ^ auVar94;
        auVar35 = packssdw(auVar35,auVar35);
        auVar35 = packsswb(auVar35,auVar35);
        if ((auVar35._6_2_ >> 8 & 1) != 0) {
          (&pNVar7[7].mark)[lVar11] = false;
        }
        auVar35 = auVar23 ^ auVar96;
        iVar71 = -(uint)(iVar69 < auVar35._0_4_);
        auVar41._4_4_ = -(uint)(iVar70 < auVar35._4_4_);
        iVar85 = -(uint)(iVar34 < auVar35._8_4_);
        auVar41._12_4_ = -(uint)(iVar86 < auVar35._12_4_);
        auVar51._4_4_ = iVar71;
        auVar51._0_4_ = iVar71;
        auVar51._8_4_ = iVar85;
        auVar51._12_4_ = iVar85;
        auVar31 = pshuflw(auVar31,auVar51,0xe8);
        auVar40._4_4_ = -(uint)(auVar35._4_4_ == iVar70);
        auVar40._12_4_ = -(uint)(auVar35._12_4_ == iVar86);
        auVar40._0_4_ = auVar40._4_4_;
        auVar40._8_4_ = auVar40._12_4_;
        auVar36 = pshuflw(auVar94,auVar40,0xe8);
        auVar41._0_4_ = auVar41._4_4_;
        auVar41._8_4_ = auVar41._12_4_;
        auVar35 = pshuflw(auVar31,auVar41,0xe8);
        auVar95._8_4_ = 0xffffffff;
        auVar95._0_8_ = 0xffffffffffffffff;
        auVar95._12_4_ = 0xffffffff;
        auVar31 = (auVar35 | auVar36 & auVar31) ^ auVar95;
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (&pNVar7[8].mark)[lVar11] = false;
        }
        auVar41 = auVar40 & auVar51 | auVar41;
        auVar31 = packssdw(auVar41,auVar41);
        auVar31 = packssdw(auVar31 ^ auVar95,auVar31 ^ auVar95);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._8_2_ >> 8 & 1) != 0) {
          (&pNVar7[9].mark)[lVar11] = false;
        }
        auVar31 = auVar25 ^ auVar96;
        iVar71 = -(uint)(iVar69 < auVar31._0_4_);
        auVar73._4_4_ = -(uint)(iVar70 < auVar31._4_4_);
        iVar85 = -(uint)(iVar34 < auVar31._8_4_);
        auVar73._12_4_ = -(uint)(iVar86 < auVar31._12_4_);
        auVar42._4_4_ = iVar71;
        auVar42._0_4_ = iVar71;
        auVar42._8_4_ = iVar85;
        auVar42._12_4_ = iVar85;
        auVar52._4_4_ = -(uint)(auVar31._4_4_ == iVar70);
        auVar52._12_4_ = -(uint)(auVar31._12_4_ == iVar86);
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        auVar73._0_4_ = auVar73._4_4_;
        auVar73._8_4_ = auVar73._12_4_;
        auVar31 = auVar52 & auVar42 | auVar73;
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packssdw(auVar31 ^ auVar95,auVar31 ^ auVar95);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          (&pNVar7[10].mark)[lVar11] = false;
        }
        auVar35 = pshufhw(auVar42,auVar42,0x84);
        auVar48 = pshufhw(auVar52,auVar52,0x84);
        auVar36 = pshufhw(auVar35,auVar73,0x84);
        auVar35 = (auVar36 | auVar48 & auVar35) ^ auVar95;
        auVar35 = packssdw(auVar35,auVar35);
        auVar35 = packsswb(auVar35,auVar35);
        if ((auVar35._10_2_ >> 8 & 1) != 0) {
          (&pNVar7[0xb].mark)[lVar11] = false;
        }
        auVar35 = auVar27 ^ auVar96;
        iVar71 = -(uint)(iVar69 < auVar35._0_4_);
        auVar44._4_4_ = -(uint)(iVar70 < auVar35._4_4_);
        iVar85 = -(uint)(iVar34 < auVar35._8_4_);
        auVar44._12_4_ = -(uint)(iVar86 < auVar35._12_4_);
        auVar53._4_4_ = iVar71;
        auVar53._0_4_ = iVar71;
        auVar53._8_4_ = iVar85;
        auVar53._12_4_ = iVar85;
        auVar31 = pshuflw(auVar31,auVar53,0xe8);
        auVar43._4_4_ = -(uint)(auVar35._4_4_ == iVar70);
        auVar43._12_4_ = -(uint)(auVar35._12_4_ == iVar86);
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        auVar36 = pshuflw(auVar95,auVar43,0xe8);
        auVar44._0_4_ = auVar44._4_4_;
        auVar44._8_4_ = auVar44._12_4_;
        auVar35 = pshuflw(auVar31,auVar44,0xe8);
        in_XMM14._8_4_ = 0xffffffff;
        in_XMM14._0_8_ = 0xffffffffffffffff;
        in_XMM14._12_4_ = 0xffffffff;
        auVar31 = (auVar35 | auVar36 & auVar31) ^ in_XMM14;
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (&pNVar7[0xc].mark)[lVar11] = false;
        }
        auVar44 = auVar43 & auVar53 | auVar44;
        auVar31 = packssdw(auVar44,auVar44);
        auVar31 = packssdw(auVar31 ^ in_XMM14,auVar31 ^ in_XMM14);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._12_2_ >> 8 & 1) != 0) {
          (&pNVar7[0xd].mark)[lVar11] = false;
        }
        auVar31 = auVar29 ^ auVar96;
        auVar74._0_4_ = -(uint)(iVar69 < auVar31._0_4_);
        auVar74._4_4_ = -(uint)(iVar70 < auVar31._4_4_);
        auVar74._8_4_ = -(uint)(iVar34 < auVar31._8_4_);
        auVar74._12_4_ = -(uint)(iVar86 < auVar31._12_4_);
        auVar45._4_4_ = auVar74._0_4_;
        auVar45._0_4_ = auVar74._0_4_;
        auVar45._8_4_ = auVar74._8_4_;
        auVar45._12_4_ = auVar74._8_4_;
        iVar69 = -(uint)(auVar31._4_4_ == iVar70);
        iVar70 = -(uint)(auVar31._12_4_ == iVar86);
        auVar32._4_4_ = iVar69;
        auVar32._0_4_ = iVar69;
        auVar32._8_4_ = iVar70;
        auVar32._12_4_ = iVar70;
        auVar54._4_4_ = auVar74._4_4_;
        auVar54._0_4_ = auVar74._4_4_;
        auVar54._8_4_ = auVar74._12_4_;
        auVar54._12_4_ = auVar74._12_4_;
        in_XMM13 = auVar32 & auVar45 | auVar54;
        auVar31 = packssdw(auVar74,in_XMM13);
        auVar31 = packssdw(auVar31 ^ in_XMM14,auVar31 ^ in_XMM14);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (&pNVar7[0xe].mark)[lVar11] = false;
        }
        auVar35 = pshufhw(auVar45,auVar45,0x84);
        auVar31 = pshufhw(auVar32,auVar32,0x84);
        auVar36 = pshufhw(auVar35,auVar54,0x84);
        auVar31 = packssdw(auVar31 & auVar35,(auVar36 | auVar31 & auVar35) ^ in_XMM14);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._14_2_ >> 8 & 1) != 0) {
          (&pNVar7[0xf].mark)[lVar11] = false;
        }
        lVar15 = auVar46._8_8_;
        auVar46._0_8_ = auVar46._0_8_ + 0x10;
        auVar46._8_8_ = lVar15 + 0x10;
        lVar15 = auVar55._8_8_;
        auVar55._0_8_ = auVar55._0_8_ + 0x10;
        auVar55._8_8_ = lVar15 + 0x10;
        lVar15 = auVar59._8_8_;
        auVar59._0_8_ = auVar59._0_8_ + 0x10;
        auVar59._8_8_ = lVar15 + 0x10;
        lVar15 = auVar77._8_8_;
        auVar77._0_8_ = auVar77._0_8_ + 0x10;
        auVar77._8_8_ = lVar15 + 0x10;
        lVar15 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 0x10;
        auVar23._8_8_ = lVar15 + 0x10;
        lVar15 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 0x10;
        auVar25._8_8_ = lVar15 + 0x10;
        lVar15 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 0x10;
        auVar27._8_8_ = lVar15 + 0x10;
        lVar15 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 0x10;
        auVar29._8_8_ = lVar15 + 0x10;
        lVar11 = lVar11 + 0x140;
      } while ((ulong)(iVar84 + 0xfU >> 4) * 0x140 != lVar11);
    }
    if (-1 < *piVar12) {
      pIVar1 = this->x;
      do {
        uVar6 = *piVar12;
        pNVar7 = (Node *)piVar12;
        if (-1 < (int)uVar6) {
          pNVar9 = this->var_nodes;
          pNVar2 = this->val_nodes;
LAB_00159a0d:
          pIVar3 = pIVar1[uVar6].var;
          pNVar4 = this->var_nodes;
          iVar84 = (pIVar3->min).v;
LAB_00159a39:
          iVar69 = iVar84;
          if (pNVar2[iVar69].mark == false) {
            iVar84 = pNVar2[iVar69].match.v;
            if ((long)iVar84 < 0) {
              iVar70 = 0x12;
            }
            else {
              pNVar2[iVar69].mark = true;
              pNVar2[iVar69].next = uVar6;
              pNVar7->next = iVar84;
              pNVar7 = pNVar4 + iVar84;
              iVar70 = 0;
            }
            if (iVar84 < 0) goto LAB_00159ab5;
          }
          iVar84 = -0x80000000;
          if (iVar69 != (pIVar3->max).v) {
            pTVar13 = pIVar3->vals + iVar69;
            do {
              pTVar13 = pTVar13 + 1;
              iVar69 = iVar69 + 1;
              iVar84 = iVar69;
            } while (pTVar13->v == '\0');
          }
          goto LAB_00159a39;
        }
LAB_00159ad1:
        pNVar7->next = -1;
      } while (-1 < *piVar12);
      this->queue_tail = &pNVar7->next;
    }
    bVar16 = false;
LAB_00159be2:
    if (!bVar16) {
      this->index = 0;
      this->stack = -1;
      uVar6 = this->range + this->sz;
      if (uVar6 != 0 && SCARRY4(this->range,this->sz) == (int)uVar6 < 0) {
        uVar8 = (ulong)(uVar6 + 0xf & 0xfffffff0);
        lVar11 = (ulong)uVar6 - 1;
        auVar18._8_4_ = (int)lVar11;
        auVar18._0_8_ = lVar11;
        auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
        pbVar10 = &this->var_nodes[0xf].mark;
        auVar33._8_4_ = 0xffffffff;
        auVar33._0_8_ = 0xffffffffffffffff;
        auVar33._12_4_ = 0xffffffff;
        auVar19 = _DAT_001db640;
        auVar20 = _DAT_001db650;
        auVar21 = _DAT_001db660;
        auVar22 = _DAT_001db670;
        auVar24 = _DAT_001db680;
        auVar26 = _DAT_001db690;
        auVar28 = _DAT_001db190;
        auVar30 = _DAT_001d7960;
        do {
          auVar46 = auVar18 ^ auVar96;
          auVar55 = auVar30 ^ auVar96;
          iVar84 = auVar46._0_4_;
          iVar86 = -(uint)(iVar84 < auVar55._0_4_);
          iVar69 = auVar46._4_4_;
          auVar57._4_4_ = -(uint)(iVar69 < auVar55._4_4_);
          iVar70 = auVar46._8_4_;
          iVar71 = -(uint)(iVar70 < auVar55._8_4_);
          iVar34 = auVar46._12_4_;
          auVar57._12_4_ = -(uint)(iVar34 < auVar55._12_4_);
          auVar75._4_4_ = iVar86;
          auVar75._0_4_ = iVar86;
          auVar75._8_4_ = iVar71;
          auVar75._12_4_ = iVar71;
          auVar46 = pshuflw(in_XMM14,auVar75,0xe8);
          auVar56._4_4_ = -(uint)(auVar55._4_4_ == iVar69);
          auVar56._12_4_ = -(uint)(auVar55._12_4_ == iVar34);
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar55 = pshuflw(auVar96,auVar56,0xe8);
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar96 = pshuflw(auVar46,auVar57,0xe8);
          auVar96 = (auVar96 | auVar55 & auVar46) ^ auVar33;
          auVar96 = packssdw(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pbVar10[-300] = false;
          }
          auVar57 = auVar56 & auVar75 | auVar57;
          auVar96 = packssdw(auVar57,auVar57);
          auVar96 = packssdw(auVar96 ^ auVar33,auVar96 ^ auVar33);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96._0_4_ >> 8 & 1) != 0) {
            pbVar10[-0x118] = false;
          }
          auVar96 = _DAT_001d7970;
          auVar46 = auVar28 ^ _DAT_001d7970;
          iVar86 = -(uint)(iVar84 < auVar46._0_4_);
          auVar88._4_4_ = -(uint)(iVar69 < auVar46._4_4_);
          iVar71 = -(uint)(iVar70 < auVar46._8_4_);
          auVar88._12_4_ = -(uint)(iVar34 < auVar46._12_4_);
          auVar58._4_4_ = iVar86;
          auVar58._0_4_ = iVar86;
          auVar58._8_4_ = iVar71;
          auVar58._12_4_ = iVar71;
          auVar76._4_4_ = -(uint)(auVar46._4_4_ == iVar69);
          auVar76._12_4_ = -(uint)(auVar46._12_4_ == iVar34);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar88._0_4_ = auVar88._4_4_;
          auVar88._8_4_ = auVar88._12_4_;
          auVar46 = auVar76 & auVar58 | auVar88;
          auVar46 = packssdw(auVar46,auVar46);
          auVar46 = packssdw(auVar46 ^ auVar33,auVar46 ^ auVar33);
          auVar46 = packsswb(auVar46,auVar46);
          if ((auVar46._0_4_ >> 0x10 & 1) != 0) {
            pbVar10[-0x104] = false;
          }
          auVar55 = pshufhw(auVar58,auVar58,0x84);
          auVar77 = pshufhw(auVar76,auVar76,0x84);
          auVar59 = pshufhw(auVar55,auVar88,0x84);
          auVar55 = (auVar59 | auVar77 & auVar55) ^ auVar33;
          auVar55 = packssdw(auVar55,auVar55);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55._0_4_ >> 0x18 & 1) != 0) {
            pbVar10[-0xf0] = false;
          }
          auVar55 = auVar26 ^ auVar96;
          iVar86 = -(uint)(iVar84 < auVar55._0_4_);
          auVar61._4_4_ = -(uint)(iVar69 < auVar55._4_4_);
          iVar71 = -(uint)(iVar70 < auVar55._8_4_);
          auVar61._12_4_ = -(uint)(iVar34 < auVar55._12_4_);
          auVar78._4_4_ = iVar86;
          auVar78._0_4_ = iVar86;
          auVar78._8_4_ = iVar71;
          auVar78._12_4_ = iVar71;
          auVar46 = pshuflw(auVar46,auVar78,0xe8);
          auVar60._4_4_ = -(uint)(auVar55._4_4_ == iVar69);
          auVar60._12_4_ = -(uint)(auVar55._12_4_ == iVar34);
          auVar60._0_4_ = auVar60._4_4_;
          auVar60._8_4_ = auVar60._12_4_;
          auVar55 = pshuflw(auVar96,auVar60,0xe8);
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar96 = pshuflw(auVar46,auVar61,0xe8);
          auVar96 = (auVar96 | auVar55 & auVar46) ^ auVar33;
          auVar96 = packssdw(auVar96,auVar96);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pbVar10[-0xdc] = false;
          }
          auVar61 = auVar60 & auVar78 | auVar61;
          auVar96 = packssdw(auVar61,auVar61);
          auVar96 = packssdw(auVar96 ^ auVar33,auVar96 ^ auVar33);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96._4_2_ >> 8 & 1) != 0) {
            pbVar10[-200] = false;
          }
          auVar96 = _DAT_001d7970;
          auVar46 = auVar24 ^ _DAT_001d7970;
          iVar86 = -(uint)(iVar84 < auVar46._0_4_);
          auVar89._4_4_ = -(uint)(iVar69 < auVar46._4_4_);
          iVar71 = -(uint)(iVar70 < auVar46._8_4_);
          auVar89._12_4_ = -(uint)(iVar34 < auVar46._12_4_);
          auVar62._4_4_ = iVar86;
          auVar62._0_4_ = iVar86;
          auVar62._8_4_ = iVar71;
          auVar62._12_4_ = iVar71;
          auVar79._4_4_ = -(uint)(auVar46._4_4_ == iVar69);
          auVar79._12_4_ = -(uint)(auVar46._12_4_ == iVar34);
          auVar79._0_4_ = auVar79._4_4_;
          auVar79._8_4_ = auVar79._12_4_;
          auVar89._0_4_ = auVar89._4_4_;
          auVar89._8_4_ = auVar89._12_4_;
          auVar46 = auVar79 & auVar62 | auVar89;
          auVar46 = packssdw(auVar46,auVar46);
          auVar46 = packssdw(auVar46 ^ auVar33,auVar46 ^ auVar33);
          auVar46 = packsswb(auVar46,auVar46);
          if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pbVar10[-0xb4] = false;
          }
          auVar55 = pshufhw(auVar62,auVar62,0x84);
          auVar77 = pshufhw(auVar79,auVar79,0x84);
          auVar59 = pshufhw(auVar55,auVar89,0x84);
          auVar55 = (auVar59 | auVar77 & auVar55) ^ auVar33;
          auVar55 = packssdw(auVar55,auVar55);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55._6_2_ >> 8 & 1) != 0) {
            pbVar10[-0xa0] = false;
          }
          auVar55 = auVar22 ^ auVar96;
          iVar86 = -(uint)(iVar84 < auVar55._0_4_);
          auVar64._4_4_ = -(uint)(iVar69 < auVar55._4_4_);
          iVar71 = -(uint)(iVar70 < auVar55._8_4_);
          auVar64._12_4_ = -(uint)(iVar34 < auVar55._12_4_);
          auVar80._4_4_ = iVar86;
          auVar80._0_4_ = iVar86;
          auVar80._8_4_ = iVar71;
          auVar80._12_4_ = iVar71;
          auVar46 = pshuflw(auVar46,auVar80,0xe8);
          auVar63._4_4_ = -(uint)(auVar55._4_4_ == iVar69);
          auVar63._12_4_ = -(uint)(auVar55._12_4_ == iVar34);
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar55 = pshuflw(auVar96,auVar63,0xe8);
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar96 = pshuflw(auVar46,auVar64,0xe8);
          auVar96 = (auVar96 | auVar55 & auVar46) ^ auVar33;
          auVar96 = packssdw(auVar96,auVar96);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pbVar10[-0x8c] = false;
          }
          auVar64 = auVar63 & auVar80 | auVar64;
          auVar96 = packssdw(auVar64,auVar64);
          auVar96 = packssdw(auVar96 ^ auVar33,auVar96 ^ auVar33);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96._8_2_ >> 8 & 1) != 0) {
            pbVar10[-0x78] = false;
          }
          auVar96 = _DAT_001d7970;
          auVar46 = auVar21 ^ _DAT_001d7970;
          iVar86 = -(uint)(iVar84 < auVar46._0_4_);
          auVar90._4_4_ = -(uint)(iVar69 < auVar46._4_4_);
          iVar71 = -(uint)(iVar70 < auVar46._8_4_);
          auVar90._12_4_ = -(uint)(iVar34 < auVar46._12_4_);
          auVar65._4_4_ = iVar86;
          auVar65._0_4_ = iVar86;
          auVar65._8_4_ = iVar71;
          auVar65._12_4_ = iVar71;
          auVar81._4_4_ = -(uint)(auVar46._4_4_ == iVar69);
          auVar81._12_4_ = -(uint)(auVar46._12_4_ == iVar34);
          auVar81._0_4_ = auVar81._4_4_;
          auVar81._8_4_ = auVar81._12_4_;
          auVar90._0_4_ = auVar90._4_4_;
          auVar90._8_4_ = auVar90._12_4_;
          auVar46 = auVar81 & auVar65 | auVar90;
          auVar46 = packssdw(auVar46,auVar46);
          auVar46 = packssdw(auVar46 ^ auVar33,auVar46 ^ auVar33);
          auVar46 = packsswb(auVar46,auVar46);
          if ((auVar46 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pbVar10[-100] = false;
          }
          auVar55 = pshufhw(auVar65,auVar65,0x84);
          auVar77 = pshufhw(auVar81,auVar81,0x84);
          auVar59 = pshufhw(auVar55,auVar90,0x84);
          auVar55 = (auVar59 | auVar77 & auVar55) ^ auVar33;
          auVar55 = packssdw(auVar55,auVar55);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55._10_2_ >> 8 & 1) != 0) {
            pbVar10[-0x50] = false;
          }
          auVar55 = auVar20 ^ auVar96;
          iVar86 = -(uint)(iVar84 < auVar55._0_4_);
          auVar67._4_4_ = -(uint)(iVar69 < auVar55._4_4_);
          iVar71 = -(uint)(iVar70 < auVar55._8_4_);
          auVar67._12_4_ = -(uint)(iVar34 < auVar55._12_4_);
          auVar82._4_4_ = iVar86;
          auVar82._0_4_ = iVar86;
          auVar82._8_4_ = iVar71;
          auVar82._12_4_ = iVar71;
          auVar46 = pshuflw(auVar46,auVar82,0xe8);
          auVar66._4_4_ = -(uint)(auVar55._4_4_ == iVar69);
          auVar66._12_4_ = -(uint)(auVar55._12_4_ == iVar34);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar55 = pshuflw(auVar96,auVar66,0xe8);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar96 = pshuflw(auVar46,auVar67,0xe8);
          auVar96 = (auVar96 | auVar55 & auVar46) ^ auVar33;
          auVar96 = packssdw(auVar96,auVar96);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pbVar10[-0x3c] = false;
          }
          auVar67 = auVar66 & auVar82 | auVar67;
          auVar96 = packssdw(auVar67,auVar67);
          auVar96 = packssdw(auVar96 ^ auVar33,auVar96 ^ auVar33);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96._12_2_ >> 8 & 1) != 0) {
            pbVar10[-0x28] = false;
          }
          auVar96 = _DAT_001d7970;
          auVar46 = auVar19 ^ _DAT_001d7970;
          auVar91._0_4_ = -(uint)(iVar84 < auVar46._0_4_);
          auVar91._4_4_ = -(uint)(iVar69 < auVar46._4_4_);
          auVar91._8_4_ = -(uint)(iVar70 < auVar46._8_4_);
          auVar91._12_4_ = -(uint)(iVar34 < auVar46._12_4_);
          auVar68._4_4_ = auVar91._0_4_;
          auVar68._0_4_ = auVar91._0_4_;
          auVar68._8_4_ = auVar91._8_4_;
          auVar68._12_4_ = auVar91._8_4_;
          iVar84 = -(uint)(auVar46._4_4_ == iVar69);
          iVar69 = -(uint)(auVar46._12_4_ == iVar34);
          auVar47._4_4_ = iVar84;
          auVar47._0_4_ = iVar84;
          auVar47._8_4_ = iVar69;
          auVar47._12_4_ = iVar69;
          auVar83._4_4_ = auVar91._4_4_;
          auVar83._0_4_ = auVar91._4_4_;
          auVar83._8_4_ = auVar91._12_4_;
          auVar83._12_4_ = auVar91._12_4_;
          in_XMM14 = auVar47 & auVar68 | auVar83;
          auVar46 = packssdw(auVar91,in_XMM14);
          auVar46 = packssdw(auVar46 ^ auVar33,auVar46 ^ auVar33);
          auVar46 = packsswb(auVar46,auVar46);
          if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pbVar10[-0x14] = false;
          }
          auVar55 = pshufhw(auVar68,auVar68,0x84);
          auVar46 = pshufhw(auVar47,auVar47,0x84);
          auVar59 = pshufhw(auVar55,auVar83,0x84);
          auVar46 = packssdw(auVar46 & auVar55,(auVar59 | auVar46 & auVar55) ^ auVar33);
          auVar46 = packsswb(auVar46,auVar46);
          if ((auVar46._14_2_ >> 8 & 1) != 0) {
            *pbVar10 = false;
          }
          lVar11 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 0x10;
          auVar30._8_8_ = lVar11 + 0x10;
          lVar11 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 0x10;
          auVar28._8_8_ = lVar11 + 0x10;
          lVar11 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 0x10;
          auVar26._8_8_ = lVar11 + 0x10;
          lVar11 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 0x10;
          auVar24._8_8_ = lVar11 + 0x10;
          lVar11 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 0x10;
          auVar22._8_8_ = lVar11 + 0x10;
          lVar11 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 0x10;
          auVar21._8_8_ = lVar11 + 0x10;
          lVar11 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 0x10;
          auVar20._8_8_ = lVar11 + 0x10;
          lVar11 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 0x10;
          auVar19._8_8_ = lVar11 + 0x10;
          pbVar10 = pbVar10 + 0x140;
          uVar8 = uVar8 - 0x10;
        } while (uVar8 != 0);
      }
      bVar16 = this->sz < 1;
      if (0 < this->sz) {
        lVar15 = 0x11;
        lVar11 = 0;
        do {
          if ((*(char *)((long)&this->var_nodes->next + lVar15) == '\0') &&
             (bVar5 = tarjan(this,(int)lVar11), !bVar5)) {
            return bVar16;
          }
          lVar11 = lVar11 + 1;
          lVar15 = lVar15 + 0x14;
          bVar16 = this->sz <= lVar11;
        } while (lVar11 < this->sz);
      }
      return bVar16;
    }
  } while( true );
LAB_00159ab5:
  if (iVar70 != 0xf) {
    if (iVar70 == 0x12) {
      this->queue_tail = &pNVar7->next;
      do {
        this_00 = local_40;
        iVar84 = this->var_nodes[(int)uVar6].match.v;
        pTVar14 = &this->val_nodes[iVar69].match;
        local_58.x = pTVar14->v;
        local_58.sz = 4;
        local_58.pt = &pTVar14->v;
        local_48 = uVar6;
        local_44 = iVar69;
        vec<TrailElem>::push(local_40,&local_58);
        this = local_38;
        iVar70 = local_44;
        pTVar14->v = uVar6;
        pTVar14 = &local_38->var_nodes[(int)uVar6].match;
        local_58.x = pTVar14->v;
        local_58.sz = 4;
        local_58.pt = &pTVar14->v;
        vec<TrailElem>::push(this_00,&local_58);
        pTVar14->v = iVar69;
        uVar6 = local_48;
        iVar69 = iVar70;
        if (-1 < (long)iVar84) {
          uVar6 = this->val_nodes[iVar84].next;
          iVar69 = iVar84;
        }
      } while (-1 < iVar84);
      bVar16 = true;
      auVar96 = _DAT_001d7970;
    }
    else {
      this->queue_tail = &pNVar7->next;
      bVar16 = iVar70 == 0;
    }
    goto LAB_00159be2;
  }
  uVar6 = pNVar9[uVar6].next;
  if ((int)uVar6 < 0) goto LAB_00159ad1;
  goto LAB_00159a0d;
}

Assistant:

bool propagate() override {
		// fprintf(stderr, "AllDiffDomain::propagate()\n");
		//  Edmonds-Karp, loop to find and augment a path
		while (true) {
			int var;
			int val;

			// visit source
			queue_tail = &queue;
			for (int i = 0; i < sz; ++i) {
				if (var_nodes[i].match < 0) {
					*queue_tail = i;
					queue_tail = &var_nodes[i].next;
				}
			}
			*queue_tail = -1;
			for (int i = 0; i < range; ++i) {
				val_nodes[i].mark = false;
			}

			// visit vars, also subsume visit of vals
			while (queue >= 0) {
				queue_tail = &queue;
				for (var = queue; var >= 0; var = var_nodes[var].next) {
					for (typename IntView<U>::iterator i = x[var].begin(); i != x[var].end(); ++i) {
						val = *i;
						if (!val_nodes[val].mark) {
							assert(val != var_nodes[var].match);
							const int next_var = val_nodes[val].match;
							if (next_var < 0) {
								goto augment;
							}

							val_nodes[val].mark = true;
							val_nodes[val].next = var;
							*queue_tail = next_var;
							queue_tail = &var_nodes[next_var].next;
						}
					}
				}
				*queue_tail = -1;
			}

			// no more augmenting paths
			break;

		augment:
			// found an augmenting path
			while (true) {
				const int parent_val = var_nodes[var].match;
				val_nodes[val].match = var;
				var_nodes[var].match = val;
				if (parent_val < 0) {
					break;
				}
				val = parent_val;
				var = val_nodes[val].next;
			}
		}
		// fprintf(stderr, "match");
		// for (int i = 0; i < sz; ++i)
		//  fprintf(stderr, " %d", var_nodes[i].match);
		// fprintf(stderr, "\n");

		index = 0;
		stack = -1;
		for (int i = 0; i < sz + range; ++i) {
			var_nodes[i].mark = false;
		}
		for (int i = 0; i < sz; ++i) {
			if (!var_nodes[i].mark && !tarjan(i)) {
				return false;
			}
		}

		return true;
	}